

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# USBControlTransfers.cpp
# Opt level: O2

void __thiscall
USBCtrlTransFieldFrame::PackFrame
          (USBCtrlTransFieldFrame *this,U32 data,U8 numBytes,U8 address,
          USBCtrlTransFieldType formatter,char *name)

{
  undefined7 in_register_00000009;
  undefined7 in_register_00000011;
  
  *(ulong *)&this->field_0x10 =
       CONCAT71(in_register_00000009,address) << 0x30 |
       (ulong)formatter << 0x28 | CONCAT71(in_register_00000011,numBytes) << 0x20 | (ulong)data;
  *(char **)&this->field_0x18 = name;
  return;
}

Assistant:

void USBCtrlTransFieldFrame::PackFrame( U32 data, U8 numBytes, U8 address, USBCtrlTransFieldType formatter, const char* name )
{
    // mData1 format:
    //
    // 66665555 55555544 44444444 33333333 33222222 22221111 11111100 00000000
    // 32109876 54321098 76543210 98765432 10987654 32109876 54321098 76543210
    // -------- -address -format- numBytes ---------------data----------------

    mData1 = data;
    mData1 |= U64( numBytes ) << 32;
    mData1 |= U64( formatter ) << 40;
    mData1 |= U64( address ) << 48;

    mData2 = ( U64 )name;
}